

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O1

void aom_highbd_v_predictor_8x4_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 4);
  *(undefined8 *)dst = uVar1;
  *(undefined8 *)(dst + 4) = uVar2;
  *(undefined8 *)(dst + stride) = uVar1;
  *(undefined8 *)(dst + stride + 4) = uVar2;
  *(undefined8 *)(dst + stride * 2) = uVar1;
  *(undefined8 *)(dst + stride * 2 + 4) = uVar2;
  *(undefined8 *)(dst + stride * 3) = uVar1;
  *(undefined8 *)(dst + stride * 3 + 4) = uVar2;
  return;
}

Assistant:

void aom_highbd_v_predictor_8x4_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above_u16 = _mm_load_si128((const __m128i *)above);
  _mm_store_si128((__m128i *)dst, above_u16);
  _mm_store_si128((__m128i *)(dst + stride), above_u16);
  _mm_store_si128((__m128i *)(dst + 2 * stride), above_u16);
  _mm_store_si128((__m128i *)(dst + 3 * stride), above_u16);
}